

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void FindFirstSets(lemon *lemp)

{
  Boolean BVar1;
  symbol *psVar2;
  symbol *psVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  symbol *s2;
  symbol *s1;
  symbol *sp;
  rule *prStack_20;
  int progress;
  rule *rp;
  int j;
  int i;
  lemon *lemp_local;
  
  for (rp._4_4_ = 0; rp._4_4_ < lemp->nsymbol; rp._4_4_ = rp._4_4_ + 1) {
    lemp->symbols[rp._4_4_]->lambda = LEMON_FALSE;
  }
  for (rp._4_4_ = lemp->nterminal; rp._4_4_ < lemp->nsymbol; rp._4_4_ = rp._4_4_ + 1) {
    pcVar6 = SetNew();
    lemp->symbols[rp._4_4_]->firstset = pcVar6;
  }
  do {
    bVar4 = false;
    for (prStack_20 = lemp->rule; prStack_20 != (rule *)0x0; prStack_20 = prStack_20->next) {
      if (prStack_20->lhs->lambda == LEMON_FALSE) {
        for (rp._4_4_ = 0; rp._4_4_ < prStack_20->nrhs; rp._4_4_ = rp._4_4_ + 1) {
          psVar2 = prStack_20->rhs[rp._4_4_];
          if ((psVar2->type != NONTERMINAL) && (psVar2->lambda != LEMON_FALSE)) {
            __assert_fail("sp->type==NONTERMINAL || sp->lambda==LEMON_FALSE",
                          "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/lemon.c",
                          0x35b,"void FindFirstSets(struct lemon *)");
          }
          if (psVar2->lambda == LEMON_FALSE) break;
        }
        if (rp._4_4_ == prStack_20->nrhs) {
          prStack_20->lhs->lambda = LEMON_TRUE;
          bVar4 = true;
        }
      }
    }
  } while (bVar4);
  do {
    sp._4_4_ = 0;
    for (prStack_20 = lemp->rule; prStack_20 != (rule *)0x0; prStack_20 = prStack_20->next) {
      psVar2 = prStack_20->lhs;
      rp._4_4_ = 0;
      while( true ) {
        if (prStack_20->nrhs <= rp._4_4_) goto LAB_00102f6c;
        psVar3 = prStack_20->rhs[rp._4_4_];
        if (psVar3->type == TERMINAL) {
          iVar5 = SetAdd(psVar2->firstset,psVar3->index);
          sp._4_4_ = iVar5 + sp._4_4_;
          goto LAB_00102f6c;
        }
        if (psVar3->type == MULTITERMINAL) break;
        if (psVar2 == psVar3) {
          BVar1 = psVar2->lambda;
        }
        else {
          iVar5 = SetUnion(psVar2->firstset,psVar3->firstset);
          sp._4_4_ = iVar5 + sp._4_4_;
          BVar1 = psVar3->lambda;
        }
        if (BVar1 == LEMON_FALSE) goto LAB_00102f6c;
        rp._4_4_ = rp._4_4_ + 1;
      }
      for (rp._0_4_ = 0; (int)rp < psVar3->nsubsym; rp._0_4_ = (int)rp + 1) {
        iVar5 = SetAdd(psVar2->firstset,psVar3->subsym[(int)rp]->index);
        sp._4_4_ = iVar5 + sp._4_4_;
      }
LAB_00102f6c:
    }
    if (sp._4_4_ == 0) {
      return;
    }
  } while( true );
}

Assistant:

void FindFirstSets(struct lemon *lemp)
{
  int i, j;
  struct rule *rp;
  int progress;

  for(i=0; i<lemp->nsymbol; i++){
    lemp->symbols[i]->lambda = LEMON_FALSE;
  }
  for(i=lemp->nterminal; i<lemp->nsymbol; i++){
    lemp->symbols[i]->firstset = SetNew();
  }

  /* First compute all lambdas */
  do{
    progress = 0;
    for(rp=lemp->rule; rp; rp=rp->next){
      if( rp->lhs->lambda ) continue;
      for(i=0; i<rp->nrhs; i++){
        struct symbol *sp = rp->rhs[i];
        assert( sp->type==NONTERMINAL || sp->lambda==LEMON_FALSE );
        if( sp->lambda==LEMON_FALSE ) break;
      }
      if( i==rp->nrhs ){
        rp->lhs->lambda = LEMON_TRUE;
        progress = 1;
      }
    }
  }while( progress );

  /* Now compute all first sets */
  do{
    struct symbol *s1, *s2;
    progress = 0;
    for(rp=lemp->rule; rp; rp=rp->next){
      s1 = rp->lhs;
      for(i=0; i<rp->nrhs; i++){
        s2 = rp->rhs[i];
        if( s2->type==TERMINAL ){
          progress += SetAdd(s1->firstset,s2->index);
          break;
        }else if( s2->type==MULTITERMINAL ){
          for(j=0; j<s2->nsubsym; j++){
            progress += SetAdd(s1->firstset,s2->subsym[j]->index);
          }
          break;
        }else if( s1==s2 ){
          if( s1->lambda==LEMON_FALSE ) break;
        }else{
          progress += SetUnion(s1->firstset,s2->firstset);
          if( s2->lambda==LEMON_FALSE ) break;
        }
      }
    }
  }while( progress );
  return;
}